

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextVkImpl::ClearDepthStencil
          (DeviceContextVkImpl *this,ITextureView *pView,CLEAR_DEPTH_STENCIL_FLAGS ClearFlags,
          float fDepth,Uint8 Stencil,RESOURCE_STATE_TRANSITION_MODE StateTransitionMode)

{
  Uint32 *pUVar1;
  TextureViewVkImpl *pTVar2;
  RenderingInfoWrapper *pRVar3;
  int iVar4;
  undefined4 extraout_var;
  TextureVkImpl *Texture;
  uint uVar6;
  undefined7 in_register_00000009;
  undefined8 uVar7;
  bool bVar8;
  string msg;
  VkClearDepthStencilValue ClearValue;
  undefined1 local_68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  VkClearRect local_48;
  long lVar5;
  undefined4 extraout_var_00;
  
  uVar7 = CONCAT71(in_register_00000009,Stencil);
  uVar6 = (uint)uVar7;
  DeviceContextBase<Diligent::EngineVkImplTraits>::ClearDepthStencil
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,pView);
  if (pView != (ITextureView *)0x0) {
    CheckDynamicType<Diligent::ITextureViewVk,Diligent::ITextureView>(pView);
  }
  EnsureVkCmdBuffer(this);
  iVar4 = (*(pView->super_IDeviceObject).super_IObject._vptr_IObject[4])(pView);
  lVar5 = CONCAT44(extraout_var,iVar4);
  if (*(char *)(lVar5 + 9) == '\x06') {
    FormatString<char[83]>
              ((string *)local_68,
               (char (*) [83])
               "Depth-stencil view of a 3D texture should\'ve been created as 2D texture array view"
              );
    uVar7 = 0x481;
    DebugAssertionFailed
              ((Char *)local_68._0_8_,"ClearDepthStencil",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x481);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._0_8_ != &local_58) {
      operator_delete((void *)local_68._0_8_,local_58._M_allocated_capacity + 1);
    }
  }
  pTVar2 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
           super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundDepthStencil.m_pObject;
  if ((pTVar2 != (TextureViewVkImpl *)pView) &&
     ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pActiveRenderPass.m_pObject !=
      (RenderPassVkImpl *)0x0)) {
    FormatString<char[214]>
              ((string *)local_68,
               (char (*) [214])
               "DSV was not found in the framebuffer. This is unexpected because TDeviceContextBase::ClearDepthStencil checks if the DSV is bound as a framebuffer attachment and triggers an assert otherwise (in development mode)."
              );
    uVar7 = 0x486;
    DebugAssertionFailed
              ((Char *)local_68._0_8_,"ClearDepthStencil",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x486);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._0_8_ != &local_58) {
      operator_delete((void *)local_68._0_8_,local_58._M_allocated_capacity + 1);
    }
  }
  if (pTVar2 == (TextureViewVkImpl *)pView) {
    pRVar3 = (this->m_DynamicRenderingInfo)._M_t.
             super___uniq_ptr_impl<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
             ._M_t.
             super__Tuple_impl<0UL,_VulkanUtilities::RenderingInfoWrapper_*,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
             .super__Head_base<0UL,_VulkanUtilities::RenderingInfoWrapper_*,_false>._M_head_impl;
    if ((pRVar3 == (RenderingInfoWrapper *)0x0) ||
       ((this->m_CommandBuffer).m_State.DynamicRenderingHash != 0)) {
      bVar8 = this->m_vkFramebuffer != (VkFramebuffer)0x0;
      if ((pRVar3 == (RenderingInfoWrapper *)0x0) &&
         (this->m_vkRenderPass == (VkRenderPass)0x0 || !bVar8)) {
        FormatString<char[26],char[98]>
                  ((string *)local_68,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "(m_vkRenderPass != VK_NULL_HANDLE && m_vkFramebuffer != VK_NULL_HANDLE) || m_DynamicRenderingInfo"
                   ,(char (*) [98])CONCAT71((int7)((ulong)uVar7 >> 8),bVar8));
        DebugAssertionFailed
                  ((Char *)local_68._0_8_,"ClearDepthStencil",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x498);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._0_8_ != &local_58) {
          operator_delete((void *)local_68._0_8_,local_58._M_allocated_capacity + 1);
        }
      }
      if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
          super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pActiveRenderPass.m_pObject ==
          (RenderPassVkImpl *)0x0) {
        TransitionRenderTargets(this,StateTransitionMode);
        CommitRenderPassAndFramebuffer(this,false);
      }
      local_58._M_allocated_capacity = 0;
      local_68._0_4_ = ClearFlags * 2 & 2;
      if ((ClearFlags & CLEAR_STENCIL_FLAG) != CLEAR_DEPTH_FLAG_NONE) {
        local_68._0_4_ = local_68._0_4_ | 4;
      }
      local_68._4_4_ = 0xffffffff;
      local_68._8_8_ = CONCAT44(uVar6,fDepth) & 0xffffffffff;
      local_48.rect.extent.width =
           (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
           super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferWidth;
      local_48.rect.extent.height =
           (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
           super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferHeight;
      local_48.rect.offset.x = 0;
      local_48.rect.offset.y = 0;
      local_48.baseArrayLayer = 0;
      local_48.layerCount = *(uint32_t *)(lVar5 + 0x18);
      VulkanUtilities::VulkanCommandBuffer::ClearAttachment
                (&this->m_CommandBuffer,(VkClearAttachment *)local_68,&local_48);
    }
    else {
      if (((ClearFlags & CLEAR_DEPTH_FLAG) != CLEAR_DEPTH_FLAG_NONE) &&
         ((pRVar3->m_RI).pDepthAttachment != (VkRenderingAttachmentInfo *)0x0)) {
        VulkanUtilities::RenderingInfoWrapper::SetDepthAttachmentClearValue(pRVar3,fDepth);
      }
      if (((ClearFlags & CLEAR_STENCIL_FLAG) != CLEAR_DEPTH_FLAG_NONE) &&
         (pRVar3 = (this->m_DynamicRenderingInfo)._M_t.
                   super___uniq_ptr_impl<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_VulkanUtilities::RenderingInfoWrapper_*,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
                   .super__Head_base<0UL,_VulkanUtilities::RenderingInfoWrapper_*,_false>.
                   _M_head_impl,
         (pRVar3->m_RI).pStencilAttachment != (VkRenderingAttachmentInfo *)0x0)) {
        VulkanUtilities::RenderingInfoWrapper::SetStencilAttachmentClearValue(pRVar3,uVar6 & 0xff);
      }
    }
  }
  else {
    EndRenderScope(this);
    iVar4 = (*(pView->super_IDeviceObject).super_IObject._vptr_IObject[10])(pView);
    Texture = (TextureVkImpl *)CONCAT44(extraout_var_00,iVar4);
    if (Texture != (TextureVkImpl *)0x0) {
      CheckDynamicType<Diligent::TextureVkImpl,Diligent::ITexture>((ITexture *)Texture);
    }
    TransitionOrVerifyTextureState
              (this,Texture,StateTransitionMode,RESOURCE_STATE_COPY_DEST,
               VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
               "Clearing depth-stencil buffer outside of render pass (DeviceContextVkImpl::ClearDepthStencil)"
              );
    local_48.rect.offset = (VkOffset2D)(CONCAT44(uVar6,fDepth) & 0xffffffffff);
    local_68._0_4_ = ClearFlags * 2 & 2;
    if ((ClearFlags & CLEAR_STENCIL_FLAG) != CLEAR_DEPTH_FLAG_NONE) {
      local_68._0_4_ = local_68._0_4_ | 4;
    }
    local_58._M_allocated_capacity._0_4_ = *(undefined4 *)(lVar5 + 0x18);
    local_68._4_4_ = *(undefined4 *)(lVar5 + 0xc);
    local_68._8_8_ = *(VkClearDepthStencilValue *)(lVar5 + 0x10);
    VulkanUtilities::VulkanCommandBuffer::ClearDepthStencilImage
              (&this->m_CommandBuffer,(Texture->m_VulkanImage).m_VkObject,
               (VkClearDepthStencilValue *)&local_48,(VkImageSubresourceRange *)local_68);
  }
  pUVar1 = &(this->m_State).NumCommands;
  *pUVar1 = *pUVar1 + 1;
  return;
}

Assistant:

void DeviceContextVkImpl::ClearDepthStencil(ITextureView*                  pView,
                                            CLEAR_DEPTH_STENCIL_FLAGS      ClearFlags,
                                            float                          fDepth,
                                            Uint8                          Stencil,
                                            RESOURCE_STATE_TRANSITION_MODE StateTransitionMode)
{
    TDeviceContextBase::ClearDepthStencil(pView);

    ITextureViewVk* pVkDSV = ClassPtrCast<ITextureViewVk>(pView);

    EnsureVkCmdBuffer();

    const TextureViewDesc& ViewDesc = pVkDSV->GetDesc();
    VERIFY(ViewDesc.TextureDim != RESOURCE_DIM_TEX_3D, "Depth-stencil view of a 3D texture should've been created as 2D texture array view");

    bool ClearAsAttachment = pVkDSV == m_pBoundDepthStencil;
    VERIFY(m_pActiveRenderPass == nullptr || ClearAsAttachment,
           "DSV was not found in the framebuffer. This is unexpected because TDeviceContextBase::ClearDepthStencil "
           "checks if the DSV is bound as a framebuffer attachment and triggers an assert otherwise (in development mode).");
    if (ClearAsAttachment)
    {
        if (m_DynamicRenderingInfo && m_CommandBuffer.GetState().DynamicRenderingHash == 0)
        {
            // Dynamic render pass has not been started yet
            if ((ClearFlags & CLEAR_DEPTH_FLAG) != 0 && m_DynamicRenderingInfo->Get().pDepthAttachment != nullptr)
            {
                m_DynamicRenderingInfo->SetDepthAttachmentClearValue(fDepth);
            }

            if ((ClearFlags & CLEAR_STENCIL_FLAG) != 0 && m_DynamicRenderingInfo->Get().pStencilAttachment != nullptr)
            {
                m_DynamicRenderingInfo->SetStencilAttachmentClearValue(Stencil);
            }
        }
        else
        {
            VERIFY_EXPR((m_vkRenderPass != VK_NULL_HANDLE && m_vkFramebuffer != VK_NULL_HANDLE) || m_DynamicRenderingInfo);
            if (m_pActiveRenderPass == nullptr)
            {
                // Render pass may not be currently committed

                TransitionRenderTargets(StateTransitionMode);
                // No need to verify states again
                CommitRenderPassAndFramebuffer(false);
            }

            VkClearAttachment ClearAttachment = {};
            ClearAttachment.aspectMask        = 0;
            if (ClearFlags & CLEAR_DEPTH_FLAG) ClearAttachment.aspectMask |= VK_IMAGE_ASPECT_DEPTH_BIT;
            if (ClearFlags & CLEAR_STENCIL_FLAG) ClearAttachment.aspectMask |= VK_IMAGE_ASPECT_STENCIL_BIT;
            // colorAttachment is only meaningful if VK_IMAGE_ASPECT_COLOR_BIT is set in aspectMask
            ClearAttachment.colorAttachment                 = VK_ATTACHMENT_UNUSED;
            ClearAttachment.clearValue.depthStencil.depth   = fDepth;
            ClearAttachment.clearValue.depthStencil.stencil = Stencil;
            VkClearRect ClearRect;
            // m_FramebufferWidth, m_FramebufferHeight are scaled to the proper mip level
            ClearRect.rect = {{0, 0}, {m_FramebufferWidth, m_FramebufferHeight}};
            // The layers [baseArrayLayer, baseArrayLayer + layerCount) count from the base layer of
            // the attachment image view, so baseArrayLayer is 0, not ViewDesc.FirstArraySlice
            ClearRect.baseArrayLayer = 0;
            ClearRect.layerCount     = ViewDesc.NumArraySlices;
            // No memory barriers are needed between vkCmdClearAttachments and preceding or
            // subsequent draw or attachment clear commands in the same subpass
            m_CommandBuffer.ClearAttachment(ClearAttachment, ClearRect);
        }
    }
    else
    {
        // End render pass to clear the buffer with vkCmdClearDepthStencilImage
        EndRenderScope();

        ITexture*      pTexture   = pVkDSV->GetTexture();
        TextureVkImpl* pTextureVk = ClassPtrCast<TextureVkImpl>(pTexture);

        // Image layout must be VK_IMAGE_LAYOUT_GENERAL or VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL
        TransitionOrVerifyTextureState(*pTextureVk, StateTransitionMode, RESOURCE_STATE_COPY_DEST, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
                                       "Clearing depth-stencil buffer outside of render pass (DeviceContextVkImpl::ClearDepthStencil)");

        VkClearDepthStencilValue ClearValue;
        ClearValue.depth   = fDepth;
        ClearValue.stencil = Stencil;
        VkImageSubresourceRange Subresource;
        Subresource.aspectMask = 0;
        if (ClearFlags & CLEAR_DEPTH_FLAG) Subresource.aspectMask |= VK_IMAGE_ASPECT_DEPTH_BIT;
        if (ClearFlags & CLEAR_STENCIL_FLAG) Subresource.aspectMask |= VK_IMAGE_ASPECT_STENCIL_BIT;
        // We are clearing the image, not image view with vkCmdClearDepthStencilImage
        Subresource.baseArrayLayer = ViewDesc.FirstArraySlice;
        Subresource.layerCount     = ViewDesc.NumArraySlices;
        Subresource.baseMipLevel   = ViewDesc.MostDetailedMip;
        Subresource.levelCount     = ViewDesc.NumMipLevels;

        m_CommandBuffer.ClearDepthStencilImage(pTextureVk->GetVkImage(), ClearValue, Subresource);
    }

    ++m_State.NumCommands;
}